

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Prog::process_key_char(Prog *this,int unichar)

{
  int iVar1;
  uint uVar2;
  SampleInstance *this_00;
  reference ppSVar3;
  
  iVar1 = toupper(unichar);
  if (iVar1 == 0x20) {
    if (this->cur_element != (Element *)0x0) {
      (*this->cur_element->_vptr_Element[3])();
      return;
    }
  }
  else {
    if (iVar1 == 0x41) {
      new_audiostream(this);
      return;
    }
    if (iVar1 == 0x4d) {
      new_mixer(this);
      return;
    }
    if (iVar1 == 0x53) {
      new_sample_instance(this);
      return;
    }
    if (iVar1 == 0x58) {
      if (this->cur_element != (Element *)0x0) {
        delete_element(this,this->cur_element);
        this->cur_element = (Element *)0x0;
      }
    }
    else {
      if (iVar1 == 0x56) {
        new_voice(this);
        return;
      }
      uVar2 = iVar1 - 0x31;
      if (((uVar2 < 9) &&
          ((ulong)uVar2 <
           (ulong)((long)(this->samples).
                         super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(this->samples).
                         super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3))) &&
         (this->cur_element != (Element *)0x0)) {
        this_00 = (SampleInstance *)
                  __dynamic_cast(this->cur_element,&Element::typeinfo,&SampleInstance::typeinfo,0);
        if (this_00 != (SampleInstance *)0x0) {
          ppSVar3 = std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::at
                              (&this->samples,(ulong)uVar2);
          SampleInstance::set_sample(this_00,*ppSVar3);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Prog::process_key_char(int unichar)
{
   int upper = toupper(unichar);
   if (upper == 'V') {
      new_voice();
   }
   else if (upper == 'M') {
      new_mixer();
   }
   else if (upper == 'S') {
      new_sample_instance();
   }
   else if (upper == 'A') {
      new_audiostream();
   }
   else if (upper == ' ') {
      if (cur_element) {
         cur_element->toggle_playing();
      }
   }
   else if (upper == 'X') {
      if (cur_element) {
         delete_element(cur_element);
         cur_element = NULL;
      }
   }
   else if (upper >= '1' && upper <= '9') {
      unsigned n = upper - '1';
      SampleInstance *splinst;
      if (n < samples.size() &&
         (splinst = dynamic_cast<SampleInstance *>(cur_element)))
      {
         splinst->set_sample(*samples.at(n));
      }
   }
}